

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

void list_push_front(list *list,list_elem *e)

{
  list_elem *plVar1;
  list_elem *plVar2;
  
  plVar1 = list->head;
  plVar2 = (list_elem *)&list->tail;
  if (plVar1 != (list_elem *)0x0) {
    plVar2 = plVar1;
  }
  plVar2->prev = e;
  list->head = e;
  e->prev = (list_elem *)0x0;
  e->next = plVar1;
  return;
}

Assistant:

void list_push_front(struct list *list, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    if (list->head == NULL) {
        list->head = e;
        list->tail = e;
        e->next = e->prev = NULL;
    }else{
        list->head->prev = e;
        e->prev = NULL;
        e->next = list->head;
        list->head = e;
    }
    IFDEF_LOCK( spin_unlock(&list->lock); );
}